

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Graph * Omega_h::invert_map_by_atomics
                  (Graph *__return_storage_ptr__,LOs *a2b,LO nb,string *b2ba_name,string *ba2a_name)

{
  int size_in;
  char *file;
  Read<int> local_250;
  Read<int> local_240;
  Write<int> local_230;
  undefined1 local_220 [8];
  LOs ba2a;
  type fill;
  string local_1c8 [32];
  undefined1 local_1a8 [8];
  Write<int> positions;
  Write<int> write_ba2a;
  undefined1 local_180 [4];
  int nba;
  Read<int> local_170;
  undefined1 local_160 [8];
  LOs b2ba;
  type count;
  string local_128 [32];
  undefined1 local_108 [8];
  Write<int> degrees;
  __cxx11 local_f0 [4];
  LO na;
  allocator local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [39];
  ScopedTimer local_51;
  string *psStack_50;
  ScopedTimer omega_h_scoped_function_timer;
  string *ba2a_name_local;
  string *b2ba_name_local;
  LO nb_local;
  LOs *a2b_local;
  ulong local_10;
  
  psStack_50 = ba2a_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_b9);
  std::operator+(local_98,(char *)local_b8);
  std::__cxx11::to_string(local_f0,0xf0);
  std::operator+(local_78,local_98);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_51,"invert_map_by_atomics",file);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  degrees.shared_alloc_.direct_ptr._4_4_ = (LO)(local_10 >> 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,"",(allocator *)((long)&count.degrees.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_108,nb,0,(string *)local_128);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&count.degrees.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&b2ba.write_.shared_alloc_.direct_ptr,a2b);
  Write<int>::Write((Write<int> *)&count.a2b.write_.shared_alloc_.direct_ptr,(Write<int> *)local_108
                   );
  parallel_for<Omega_h::invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            (degrees.shared_alloc_.direct_ptr._4_4_,(type *)&b2ba.write_.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)local_180,(Write<int> *)local_108);
  Read<int>::Read(&local_170,(Write<int> *)local_180);
  offset_scan<int>((Omega_h *)local_160,&local_170,b2ba_name);
  Read<int>::~Read(&local_170);
  Write<int>::~Write((Write<int> *)local_180);
  size_in = Read<int>::get((Read<int> *)local_160,nb);
  Write<int>::Write((Write<int> *)&positions.shared_alloc_.direct_ptr,size_in,psStack_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,"",(allocator *)((long)&fill.write_ba2a.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_1a8,nb,0,(string *)local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&fill.write_ba2a.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)&ba2a.write_.shared_alloc_.direct_ptr,a2b);
  Read<int>::Read((Read<int> *)&fill.a2b.write_.shared_alloc_.direct_ptr,(Read<int> *)local_160);
  Write<int>::Write((Write<int> *)&fill.b2ba.write_.shared_alloc_.direct_ptr,(Write<int> *)local_1a8
                   );
  Write<int>::Write((Write<int> *)&fill.positions.shared_alloc_.direct_ptr,
                    (Write<int> *)&positions.shared_alloc_.direct_ptr);
  parallel_for<Omega_h::invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)::__1>
            (degrees.shared_alloc_.direct_ptr._4_4_,(type *)&ba2a.write_.shared_alloc_.direct_ptr);
  Write<int>::Write(&local_230,(Write<int> *)&positions.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)local_220,&local_230);
  Write<int>::~Write(&local_230);
  Read<int>::Read(&local_240,(Read<int> *)local_160);
  Read<int>::Read(&local_250,(Read<int> *)local_220);
  Graph::Graph(__return_storage_ptr__,&local_240,&local_250);
  Read<int>::~Read(&local_250);
  Read<int>::~Read(&local_240);
  Read<int>::~Read((Read<int> *)local_220);
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_1::~__1((__1 *)&ba2a.write_.shared_alloc_.direct_ptr);
  Write<int>::~Write((Write<int> *)local_1a8);
  Write<int>::~Write((Write<int> *)&positions.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)local_160);
  invert_map_by_atomics(Omega_h::Read<int>,int,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)&b2ba.write_.shared_alloc_.direct_ptr);
  Write<int>::~Write((Write<int> *)local_108);
  ScopedTimer::~ScopedTimer(&local_51);
  return __return_storage_ptr__;
}

Assistant:

Graph invert_map_by_atomics(LOs const a2b, LO const nb,
    std::string const& b2ba_name, std::string const& ba2a_name) {
  OMEGA_H_TIME_FUNCTION;
  auto const na = a2b.size();
  Write<LO> degrees(nb, 0);
  auto count = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    atomic_increment(&degrees[b]);
  };
  parallel_for(na, std::move(count));
  auto const b2ba = offset_scan(Read<LO>(degrees), b2ba_name);
  auto const nba = b2ba.get(nb);
  Write<LO> write_ba2a(nba, ba2a_name);
  auto const positions = Write<LO>(nb, 0);
  auto fill = OMEGA_H_LAMBDA(LO a) {
    auto const b = a2b[a];
    auto const first = b2ba[b];
    auto const j = atomic_fetch_add(&positions[b], 1);
    write_ba2a[first + j] = a;
  };
  parallel_for(na, std::move(fill));
  auto const ba2a = LOs(write_ba2a);
  return Graph(b2ba, ba2a);
}